

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_steam.cpp
# Opt level: O0

void PSR_FindEndBlock(FScanner *sc)

{
  bool bVar1;
  undefined4 local_14;
  int depth;
  FScanner *sc_local;
  
  local_14 = 1;
  do {
    bVar1 = FScanner::CheckToken(sc,0x7d);
    if (bVar1) {
      local_14 = local_14 + -1;
    }
    else {
      bVar1 = FScanner::CheckToken(sc,0x7b);
      if (bVar1) {
        local_14 = local_14 + 1;
      }
      else {
        FScanner::MustGetAnyToken(sc);
      }
    }
  } while (local_14 != 0);
  return;
}

Assistant:

static void PSR_FindEndBlock(FScanner &sc)
{
	int depth = 1;
	do
	{
		if(sc.CheckToken('}'))
			--depth;
		else if(sc.CheckToken('{'))
			++depth;
		else
			sc.MustGetAnyToken();
	}
	while(depth);
}